

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_pred.hpp
# Opt level: O2

AssertionResult *
iutest::AssertPred5Helper<bool(*)(int,int,int,int,int),int,int,int,int,int>
          (char *pred_str,char *expr1,char *expr2,char *expr3,char *expr4,char *expr5,
          _func_bool_int_int_int_int_int *pred,int val1,int val2,int val3,int val4,int val5)

{
  char cVar1;
  AssertionResult *pAVar2;
  AssertionResult *in_RDI;
  int in_stack_00000030;
  int in_stack_00000038;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  AssertionResult local_38;
  
  cVar1 = (*(code *)expr3)((ulong)expr2 & 0xffffffff,(ulong)expr1 & 0xffffffff,
                           (ulong)pred_str & 0xffffffff,in_stack_00000030,in_stack_00000038);
  if (cVar1 == '\0') {
    local_38.m_message._M_dataplus._M_p = (pointer)&local_38.m_message.field_2;
    local_38.m_message._M_string_length = 0;
    local_38.m_message.field_2._M_local_buf[0] = '\0';
    local_38.m_result = false;
    pAVar2 = AssertionResult::operator<<(&local_38,(char (*) [8])"error: ");
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_40);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x201752);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_48);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [3])0x1fed7f);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_50);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [3])0x1fed7f);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_58);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [3])0x1fed7f);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_60);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [3])0x1fed7f);
    pAVar2 = AssertionResult::operator<<(pAVar2,&expr4);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [29])") evaluates to false, where ");
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x1fcf4d);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_48);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [4])0x1fecf6);
    pAVar2 = AssertionResult::operator<<(pAVar2,(int *)&expr2);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x1fcf4d);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_50);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [4])0x1fecf6);
    pAVar2 = AssertionResult::operator<<(pAVar2,(int *)&expr1);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x1fcf4d);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_58);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [4])0x1fecf6);
    pAVar2 = AssertionResult::operator<<(pAVar2,(int *)&pred_str);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x1fcf4d);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_60);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [4])0x1fecf6);
    pAVar2 = AssertionResult::operator<<(pAVar2,&stack0x00000030);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x1fcf4d);
    pAVar2 = AssertionResult::operator<<(pAVar2,&expr4);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [4])0x1fecf6);
    pAVar2 = AssertionResult::operator<<(pAVar2,&stack0x00000038);
    AssertionResult::AssertionResult(in_RDI,pAVar2);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    (in_RDI->m_message)._M_dataplus._M_p = (pointer)&(in_RDI->m_message).field_2;
    (in_RDI->m_message)._M_string_length = 0;
    (in_RDI->m_message).field_2._M_local_buf[0] = '\0';
    in_RDI->m_result = true;
  }
  return in_RDI;
}

Assistant:

AssertionResult AssertPred5Helper(const char* pred_str
    , const char* expr1, const char* expr2, const char* expr3, const char* expr4, const char* expr5
    , PRED pred, T1 val1, T2 val2, T3 val3, T4 val4, T5 val5)
{
    if IUTEST_COND_LIKELY( (*pred)(val1, val2, val3, val4, val5) )
    {
        return AssertionSuccess();
    }
    return AssertionFailure() << "error: " << pred_str << "("
        << expr1 << ", " << expr2 << ", " << expr3 << ", " << expr4 << ", " << expr5
        << ") evaluates to false, where "
        << "\n" << expr1 << " : " << val1
        << "\n" << expr2 << " : " << val2
        << "\n" << expr3 << " : " << val3
        << "\n" << expr4 << " : " << val4
        << "\n" << expr5 << " : " << val5;
}